

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O1

char cs_impl::check_args_helper<cs::numeric,_2>::check(any *val)

{
  int iVar1;
  undefined4 extraout_var;
  undefined *puVar2;
  runtime_error *this;
  long *plVar3;
  size_type *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (val->mDat == (proxy *)0x0) {
    puVar2 = &void::typeinfo;
  }
  else {
    iVar1 = (*val->mDat->data->_vptr_baseHolder[2])();
    puVar2 = (undefined *)CONCAT44(extraout_var,iVar1);
  }
  if (*(char **)(puVar2 + 8) != "N2cs7numericE") {
    iVar1 = strcmp("N2cs7numericE",*(char **)(puVar2 + 8));
    if (iVar1 != 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::to_string(&local_a8,3);
      std::operator+(&local_88,"Invalid Argument. At ",&local_a8);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_88);
      local_128._M_dataplus._M_p = (pointer)*plVar3;
      psVar4 = (size_type *)(plVar3 + 2);
      if ((size_type *)local_128._M_dataplus._M_p == psVar4) {
        local_128.field_2._M_allocated_capacity = *psVar4;
        local_128.field_2._8_8_ = plVar3[3];
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      }
      else {
        local_128.field_2._M_allocated_capacity = *psVar4;
      }
      local_128._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      cxx_demangle_abi_cxx11_(&local_c8,(cs_impl *)"cs::numeric",(char *)local_128._M_string_length)
      ;
      std::operator+(&local_68,&local_128,&local_c8);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_68);
      local_108._M_dataplus._M_p = (pointer)*plVar3;
      psVar4 = (size_type *)(plVar3 + 2);
      if ((size_type *)local_108._M_dataplus._M_p == psVar4) {
        local_108.field_2._M_allocated_capacity = *psVar4;
        local_108.field_2._8_8_ = plVar3[3];
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      }
      else {
        local_108.field_2._M_allocated_capacity = *psVar4;
      }
      local_108._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      any::get_type_name_abi_cxx11_(&local_e8,val);
      std::operator+(&local_48,&local_108,&local_e8);
      cs::runtime_error::runtime_error(this,&local_48);
      __cxa_throw(this,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
    }
  }
  return '\0';
}

Assistant:

static inline char check(const any &val)
		{
			if (typeid(T) != val.type())
				throw cs::runtime_error("Invalid Argument. At " + std::to_string(index + 1) + ". Expected " +
				                        cxx_demangle(get_name_of_type<T>()) + ", provided " + val.get_type_name());
			else
				return 0;
		}